

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlerror.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QSqlError *s)

{
  QDebug *this;
  QString *t;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QString *in_stack_ffffffffffffff48;
  QDebug *in_stack_ffffffffffffff50;
  char *this_00;
  QDebug *in_stack_ffffffffffffff58;
  QDebugStateSaver *this_01;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_01 = (QDebugStateSaver *)&local_10;
  QDebugStateSaver::QDebugStateSaver(this_01,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  this = QDebug::operator<<(in_stack_ffffffffffffff58,(char *)this_01);
  QSqlError::nativeErrorCode((QSqlError *)in_stack_ffffffffffffff48);
  QDebug::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = ", ";
  t = (QString *)QDebug::operator<<(in_stack_ffffffffffffff58,(char *)this_01);
  QSqlError::driverText((QSqlError *)t);
  QDebug::operator<<((QDebug *)this_00,t);
  QDebug::operator<<(in_stack_ffffffffffffff58,(char *)this_01);
  QSqlError::databaseText((QSqlError *)t);
  QDebug::operator<<((QDebug *)this_00,t);
  QDebug::operator<<(this,(char)((ulong)in_RDI >> 0x38));
  QString::~QString((QString *)0x132281);
  QString::~QString((QString *)0x13228b);
  QString::~QString((QString *)0x132295);
  QDebug::QDebug(this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlError &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlError(" << s.nativeErrorCode() << ", " << s.driverText()
        << ", " << s.databaseText() << ')';
    return dbg;
}